

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int llhttp__before_headers_complete(llhttp_t *parser,char *p,char *endp)

{
  bool local_19;
  char *endp_local;
  char *p_local;
  llhttp_t *parser_local;
  
  if (((parser->flags & 0x10) == 0) || ((parser->flags & 4) == 0)) {
    parser->upgrade = parser->method == '\x05';
  }
  else {
    local_19 = true;
    if (parser->type != '\x01') {
      local_19 = parser->status_code == 0x65;
    }
    parser->upgrade = local_19;
  }
  return 0;
}

Assistant:

int llhttp__before_headers_complete(llhttp_t* parser, const char* p,
                                    const char* endp) {
  /* Set this here so that on_headers_complete() callbacks can see it */
  if ((parser->flags & F_UPGRADE) &&
      (parser->flags & F_CONNECTION_UPGRADE)) {
    /* For responses, "Upgrade: foo" and "Connection: upgrade" are
     * mandatory only when it is a 101 Switching Protocols response,
     * otherwise it is purely informational, to announce support.
     */
    parser->upgrade =
        (parser->type == HTTP_REQUEST || parser->status_code == 101);
  } else {
    parser->upgrade = (parser->method == HTTP_CONNECT);
  }
  return 0;
}